

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O2

ReadWriter_ptr __thiscall XipFile::getrvareader(XipFile *this,uint32_t rva,uint32_t size)

{
  _func_int **pp_Var1;
  OffsetReader *this_00;
  RangeReader *this_01;
  uint in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  ReadWriter_ptr RVar2;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = (OffsetReader *)operator_new(0x30);
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             (__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)
             (CONCAT44(in_register_00000034,rva) + 8));
  OffsetReader::OffsetReader
            (this_00,(ReadWriter_ptr *)&local_40,
             (ulong)(size - *(int *)(CONCAT44(in_register_00000034,rva) + 0xa0)),(ulong)in_ECX);
  std::__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<OffsetReader,void>
            ((__shared_ptr<ReadWriter,(__gnu_cxx::_Lock_policy)2> *)this,this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  this_01 = (RangeReader *)operator_new(0x40);
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,(__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)this);
  RangeReader::RangeReader(this_01,(ReadWriter_ptr *)&local_50,0,(ulong)in_ECX);
  std::__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>::reset<RangeReader>
            ((__shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2> *)this,this_01);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  pp_Var1 = (this->super_FileContainer)._vptr_FileContainer;
  (**(code **)(*pp_Var1 + 0x20))(pp_Var1,0);
  RVar2.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  RVar2.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ReadWriter_ptr)RVar2.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ReadWriter_ptr getrvareader(uint32_t rva, uint32_t size)
    {
        ReadWriter_ptr r(new OffsetReader(_r, rva-_hdr.rvabase, size));
        r.reset(new RangeReader(r, 0, size));
        r->setpos(0);
        return r;
    }